

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifadw(bifcxdef *ctx,int argc)

{
  ushort objn;
  prpnum p;
  runcxdef *prVar1;
  runsdef *prVar2;
  voccxdef *ctx_00;
  uchar *wrdtxt;
  uint classflg;
  
  prVar1 = ctx->bifcxrun;
  prVar2 = prVar1->runcxsp;
  ctx_00 = prVar1->runcxvoc;
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x02') {
    prVar1->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar2 = prVar1->runcxsp;
  objn = (prVar2->runsv).runsvobj;
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\r') {
    prVar1->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f4);
  }
  prVar2 = prVar1->runcxsp;
  p = (prVar2->runsv).runsvprp;
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x03') {
    prVar1->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  if ((ushort)(p - 2) < 6) {
    wrdtxt = (prVar1->runcxsp->runsv).runsvstr;
    classflg = (ctx_00->voccxinh[objn >> 8][objn & 0xff]->vociu).vocius.vociusflg & 1 | 4;
    vocadd(ctx_00,p,objn,classflg,(char *)wrdtxt);
    vocdusave_addwrd(ctx_00,objn,p,classflg,(char *)wrdtxt);
    return;
  }
  prVar1->runcxerr->errcxptr->erraav[0].errastr = "addword";
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
  runsign(ctx->bifcxrun,0x400);
}

Assistant:

void bifadw(bifcxdef *ctx, int argc)
{
    uchar    *wrd;
    objnum    objn;
    prpnum    prpn;
    vocidef  *voci;
    int       classflg;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;

    bifcntargs(ctx, 3, argc);

    /* get the arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    wrd = runpopstr(ctx->bifcxrun);

    /* make sure the property is a valid part of speech property */
    if (!prpisvoc(prpn))
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "addword");

    /* get the vocidef for the object, and see if it's a class object */
    voci = vocinh(voc, objn);

    classflg = VOCFNEW;
    if (voci->vociflg & VOCIFCLASS) classflg |= VOCFCLASS;

    /* add the word */
    vocadd(voc, prpn, objn, classflg, (char *)wrd);

    /* generate undo for the operation */
    vocdusave_addwrd(voc, objn, prpn, classflg, (char *)wrd);
}